

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

int pageant_enum_keys(pageant_key_enum_fn_t callback,void *callback_ctx,char **retstr)

{
  int iVar1;
  KeyList *kl;
  KeyList *kl_00;
  char **ppcVar2;
  char *pcVar3;
  ulong uVar4;
  long lVar5;
  long unaff_R13;
  ptrlen string;
  ptrlen pl;
  ptrlen string_00;
  ptrlen pl_00;
  ptrlen blob;
  pageant_pubkey cbkey;
  BinarySource src [1];
  RSAKey rkey;
  pageant_pubkey local_d0;
  pageant_key_enum_fn_t local_b8;
  char **local_b0;
  BinarySource local_a8;
  RSAKey local_78;
  
  local_b0 = retstr;
  kl = pageant_get_keylist(1);
  if ((kl == (KeyList *)0x0) || (kl->broken == false)) {
    kl_00 = pageant_get_keylist(2);
    if ((kl_00 != (KeyList *)0x0) && (kl_00->broken != false)) {
      pcVar3 = "Received broken SSH-2 key list from agent";
      goto LAB_00115157;
    }
    if (kl != (KeyList *)0x0) {
      local_b8 = callback;
      if (kl->nkeys != 0) {
        unaff_R13 = 0;
        uVar4 = 0;
        do {
          string.len = *(size_t *)((long)&(kl->keys->blob).len + unaff_R13);
          string.ptr = *(void **)((long)&(kl->keys->blob).ptr + unaff_R13);
          local_d0.blob = strbuf_dup(string);
          pl.len = *(size_t *)((long)&(kl->keys->comment).len + unaff_R13);
          pl.ptr = *(void **)((long)&(kl->keys->comment).ptr + unaff_R13);
          local_d0.comment = mkstr(pl);
          local_d0.ssh_version = 1;
          local_78.sshk.vt = (ssh_keyalg *)0x0;
          local_78.iqmp = (mp_int *)0x0;
          local_78.comment = (char *)0x0;
          local_78.p = (mp_int *)0x0;
          local_78.q = (mp_int *)0x0;
          local_78.exponent = (mp_int *)0x0;
          local_78.private_exponent = (mp_int *)0x0;
          local_78.bits = 0;
          local_78.bytes = 0;
          local_78.modulus = (mp_int *)0x0;
          local_a8.data = *(void **)((long)&(kl->keys->blob).ptr + unaff_R13);
          local_a8.len = *(size_t *)((long)&(kl->keys->blob).len + unaff_R13);
          local_a8.pos = 0;
          local_a8.err = BSE_NO_ERROR;
          local_a8.binarysource_ = &local_a8;
          BinarySource_get_rsa_ssh1_pub(local_a8.binarysource_,&local_78,RSA_SSH1_EXPONENT_FIRST);
          if ((local_a8.binarysource_)->err == BSE_NO_ERROR) {
            ppcVar2 = rsa_ssh1_fake_all_fingerprints(&local_78);
            freersakey(&local_78);
            (*local_b8)(callback_ctx,ppcVar2,local_d0.comment,
                        *(uint32_t *)((long)&kl->keys->flags + unaff_R13),&local_d0);
            strbuf_free(local_d0.blob);
            safefree(local_d0.comment);
            ssh2_free_all_fingerprints(ppcVar2);
            iVar1 = 0;
          }
          else {
            pcVar3 = dupstr("Received an invalid SSH-1 key from agent");
            *local_b0 = pcVar3;
            iVar1 = 2;
          }
          if (iVar1 != 0) goto LAB_001152cd;
          uVar4 = uVar4 + 1;
          unaff_R13 = unaff_R13 + 0x28;
        } while (uVar4 < kl->nkeys);
      }
      iVar1 = 3;
LAB_001152cd:
      if (iVar1 == 2) {
        iVar1 = 1;
        goto LAB_001153ac;
      }
      callback = local_b8;
      if (iVar1 != 3) {
        return (int)unaff_R13;
      }
    }
    if ((kl_00 != (KeyList *)0x0) && (kl_00->nkeys != 0)) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        string_00.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
        string_00.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
        local_d0.blob = strbuf_dup(string_00);
        pl_00.len = *(size_t *)((long)&(kl_00->keys->comment).len + lVar5);
        pl_00.ptr = *(void **)((long)&(kl_00->keys->comment).ptr + lVar5);
        local_d0.comment = mkstr(pl_00);
        local_d0.ssh_version = 2;
        blob.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
        blob.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
        ppcVar2 = ssh2_all_fingerprints_for_blob(blob);
        (*callback)(callback_ctx,ppcVar2,local_d0.comment,
                    *(uint32_t *)((long)&kl_00->keys->flags + lVar5),&local_d0);
        ssh2_free_all_fingerprints(ppcVar2);
        safefree(local_d0.comment);
        strbuf_free(local_d0.blob);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x28;
      } while (uVar4 < kl_00->nkeys);
    }
    pcVar3 = (char *)0x0;
    iVar1 = 0;
  }
  else {
    pcVar3 = "Received broken SSH-1 key list from agent";
    kl_00 = (KeyList *)0x0;
LAB_00115157:
    pcVar3 = dupstr(pcVar3);
    iVar1 = 1;
  }
  *local_b0 = pcVar3;
LAB_001153ac:
  if (kl != (KeyList *)0x0) {
    keylist_free(kl);
  }
  if (kl_00 != (KeyList *)0x0) {
    keylist_free(kl_00);
  }
  return iVar1;
}

Assistant:

int pageant_enum_keys(pageant_key_enum_fn_t callback, void *callback_ctx,
                      char **retstr)
{
    KeyList *kl1 = NULL, *kl2 = NULL;
    struct pageant_pubkey cbkey;
    int toret = PAGEANT_ACTION_FAILURE;

    kl1 = pageant_get_keylist(1);
    if (kl1 && kl1->broken) {
        *retstr = dupstr("Received broken SSH-1 key list from agent");
        goto out;
    }

    kl2 = pageant_get_keylist(2);
    if (kl2 && kl2->broken) {
        *retstr = dupstr("Received broken SSH-2 key list from agent");
        goto out;
    }

    if (kl1) {
        for (size_t i = 0; i < kl1->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl1->keys[i].blob);
            cbkey.comment = mkstr(kl1->keys[i].comment);
            cbkey.ssh_version = 1;

            /* Decode public blob into a key in order to fingerprint it */
            RSAKey rkey;
            memset(&rkey, 0, sizeof(rkey));
            {
                BinarySource src[1];
                BinarySource_BARE_INIT_PL(src, kl1->keys[i].blob);
                get_rsa_ssh1_pub(src, &rkey, RSA_SSH1_EXPONENT_FIRST);
                if (get_err(src)) {
                    *retstr = dupstr(
                        "Received an invalid SSH-1 key from agent");
                    goto out;
                }
            }
            char **fingerprints = rsa_ssh1_fake_all_fingerprints(&rkey);
            freersakey(&rkey);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl1->keys[i].flags, &cbkey);

            strbuf_free(cbkey.blob);
            sfree(cbkey.comment);
            ssh2_free_all_fingerprints(fingerprints);
        }
    }

    if (kl2) {
        for (size_t i = 0; i < kl2->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl2->keys[i].blob);
            cbkey.comment = mkstr(kl2->keys[i].comment);
            cbkey.ssh_version = 2;

            char **fingerprints =
                ssh2_all_fingerprints_for_blob(kl2->keys[i].blob);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl2->keys[i].flags, &cbkey);

            ssh2_free_all_fingerprints(fingerprints);
            sfree(cbkey.comment);
            strbuf_free(cbkey.blob);
        }
    }

    *retstr = NULL;
    toret = PAGEANT_ACTION_OK;
  out:
    if (kl1)
        keylist_free(kl1);
    if (kl2)
        keylist_free(kl2);
    return toret;
}